

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O1

ChLoad<MyLoaderPointStiff> * __thiscall
chrono::ChLoad<MyLoaderPointStiff>::Clone(ChLoad<MyLoaderPointStiff> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double dVar2;
  ChLoad<MyLoaderPointStiff> *this_00;
  
  this_00 = (ChLoad<MyLoaderPointStiff> *)operator_new(0x80);
  chrono::ChObj::ChObj((ChObj *)this_00,(ChObj *)this);
  *(code **)this_00 = chrono::ChLoadCustom::LoadGetStateBlock_w;
  *(undefined8 *)&this_00->field_0x38 = *(undefined8 *)&this->field_0x38;
  *(undefined ***)this_00 = &PTR__ChLoad_00139298;
  (this_00->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoader_00138bd8;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)
             &(this_00->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.super_ChLoader.Q,
             (DenseStorage<double,__1,__1,_1,_0> *)
             &(this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.super_ChLoader.Q);
  (this_00->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_001390d8;
  (this_00->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
  super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
       super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this_00->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
  super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this_00->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_001396c8;
  dVar2 = (this->loader).super_ChLoaderUVWatomic.Pv;
  (this_00->loader).super_ChLoaderUVWatomic.Pu = (this->loader).super_ChLoaderUVWatomic.Pu;
  (this_00->loader).super_ChLoaderUVWatomic.Pv = dVar2;
  (this_00->loader).super_ChLoaderUVWatomic.Pw = (this->loader).super_ChLoaderUVWatomic.Pw;
  (this_00->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_00139368;
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }